

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O1

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab,float X,float Y,float Z,uint32_t *r,uint32_t *g,
                 uint32_t *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = (cielab->display).d_mat[0][2] * Z +
          (cielab->display).d_mat[0][0] * X + (cielab->display).d_mat[0][1] * Y;
  fVar8 = (cielab->display).d_mat[1][2] * Z +
          (cielab->display).d_mat[1][0] * X + (cielab->display).d_mat[1][1] * Y;
  fVar7 = Z * (cielab->display).d_mat[2][2] +
          X * (cielab->display).d_mat[2][0] + Y * (cielab->display).d_mat[2][1];
  fVar1 = (cielab->display).d_Y0R;
  if (fVar9 <= fVar1) {
    fVar9 = fVar1;
  }
  fVar2 = (cielab->display).d_Y0G;
  if (fVar8 <= fVar2) {
    fVar8 = fVar2;
  }
  fVar3 = (cielab->display).d_YCR;
  if (fVar3 <= fVar9) {
    fVar9 = fVar3;
  }
  fVar3 = (cielab->display).d_YCG;
  if (fVar3 <= fVar8) {
    fVar8 = fVar3;
  }
  fVar3 = (cielab->display).d_Y0B;
  if (fVar7 <= fVar3) {
    fVar7 = fVar3;
  }
  iVar5 = (int)((fVar9 - fVar1) / cielab->rstep);
  if (cielab->range < iVar5) {
    iVar5 = cielab->range;
  }
  fVar9 = 0.5;
  fVar1 = 0.5;
  if (cielab->Yr2r[iVar5] <= 0.0) {
    fVar1 = -0.5;
  }
  fVar4 = (cielab->display).d_YCB;
  if (fVar4 <= fVar7) {
    fVar7 = fVar4;
  }
  *r = (uint32_t)(long)(fVar1 + cielab->Yr2r[iVar5]);
  iVar5 = (int)((fVar8 - fVar2) / cielab->gstep);
  if (cielab->range < iVar5) {
    iVar5 = cielab->range;
  }
  fVar1 = 0.5;
  if (cielab->Yg2g[iVar5] <= 0.0) {
    fVar1 = -0.5;
  }
  *g = (uint32_t)(long)(fVar1 + cielab->Yg2g[iVar5]);
  iVar5 = (int)((fVar7 - fVar3) / cielab->bstep);
  if (cielab->range < iVar5) {
    iVar5 = cielab->range;
  }
  if (cielab->Yb2b[iVar5] <= 0.0) {
    fVar9 = -0.5;
  }
  *b = (uint32_t)(long)(fVar9 + cielab->Yb2b[iVar5]);
  uVar6 = (cielab->display).d_Vrwr;
  if (*r < uVar6) {
    uVar6 = *r;
  }
  *r = uVar6;
  uVar6 = (cielab->display).d_Vrwg;
  if (*g < uVar6) {
    uVar6 = *g;
  }
  *g = uVar6;
  uVar6 = (cielab->display).d_Vrwb;
  if (*b < uVar6) {
    uVar6 = *b;
  }
  *b = uVar6;
  return;
}

Assistant:

void TIFFXYZToRGB(TIFFCIELabToRGB *cielab, float X, float Y, float Z,
                  uint32_t *r, uint32_t *g, uint32_t *b)
{
    int i;
    float Yr, Yg, Yb;
    float *matrix = &cielab->display.d_mat[0][0];

    /* Multiply through the matrix to get luminosity values. */
    Yr = matrix[0] * X + matrix[1] * Y + matrix[2] * Z;
    Yg = matrix[3] * X + matrix[4] * Y + matrix[5] * Z;
    Yb = matrix[6] * X + matrix[7] * Y + matrix[8] * Z;

    /* Clip input */
    Yr = TIFFmax(Yr, cielab->display.d_Y0R);
    Yg = TIFFmax(Yg, cielab->display.d_Y0G);
    Yb = TIFFmax(Yb, cielab->display.d_Y0B);

    /* Avoid overflow in case of wrong input values */
    Yr = TIFFmin(Yr, cielab->display.d_YCR);
    Yg = TIFFmin(Yg, cielab->display.d_YCG);
    Yb = TIFFmin(Yb, cielab->display.d_YCB);

    /* Turn luminosity to colour value. */
    i = (int)((Yr - cielab->display.d_Y0R) / cielab->rstep);
    i = TIFFmin(cielab->range, i);
    *r = RINT(cielab->Yr2r[i]);

    i = (int)((Yg - cielab->display.d_Y0G) / cielab->gstep);
    i = TIFFmin(cielab->range, i);
    *g = RINT(cielab->Yg2g[i]);

    i = (int)((Yb - cielab->display.d_Y0B) / cielab->bstep);
    i = TIFFmin(cielab->range, i);
    *b = RINT(cielab->Yb2b[i]);

    /* Clip output. */
    *r = TIFFmin(*r, cielab->display.d_Vrwr);
    *g = TIFFmin(*g, cielab->display.d_Vrwg);
    *b = TIFFmin(*b, cielab->display.d_Vrwb);
}